

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi__uint16 * stbi__convert_8_to_16(stbi_uc *orig,int w,int h,int channels)

{
  int iVar1;
  stbi__uint16 *enlarged;
  int local_28;
  int img_len;
  int i;
  int channels_local;
  int h_local;
  int w_local;
  stbi_uc *orig_local;
  
  iVar1 = w * h * channels;
  orig_local = (stbi_uc *)stbi__malloc((long)(iVar1 * 2));
  if (orig_local == (stbi_uc *)0x0) {
    stbi__err("outofmem");
    orig_local = (stbi_uc *)0x0;
  }
  else {
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      *(ushort *)(orig_local + (long)local_28 * 2) =
           (ushort)orig[local_28] * 0x100 + (ushort)orig[local_28];
    }
    free(orig);
  }
  return (stbi__uint16 *)orig_local;
}

Assistant:

static stbi__uint16 *stbi__convert_8_to_16(stbi_uc *orig, int w, int h, int channels)
{
   int i;
   int img_len = w * h * channels;
   stbi__uint16 *enlarged;

   enlarged = (stbi__uint16 *) stbi__malloc(img_len*2);
   if (enlarged == NULL) return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");

   for (i = 0; i < img_len; ++i)
      enlarged[i] = (stbi__uint16)((orig[i] << 8) + orig[i]); // replicate to high and low byte, maps 0->0, 255->0xffff

   STBI_FREE(orig);
   return enlarged;
}